

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinit.c
# Opt level: O0

uint ubound(uint lower,uint value,uint upper)

{
  uint upper_local;
  uint value_local;
  uint lower_local;
  
  value_local = lower;
  if ((lower < value) && (value_local = value, upper <= value)) {
    value_local = upper;
  }
  return value_local;
}

Assistant:

static inline unsigned ubound(unsigned lower, unsigned value, unsigned upper)
{
  if (value <= lower)
    return (lower);
  else if (value >= upper)
    return (upper);
  else
    return (value);
}